

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

char * flatcc_builder_append_string(flatcc_builder_t *B,char *s,size_t len)

{
  uint uVar1;
  __flatcc_builder_frame_t *p_Var2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  
  p_Var2 = B->frame;
  if (p_Var2->type != 6) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_string",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x3db,
                  "char *flatcc_builder_append_string(flatcc_builder_t *, const char *, size_t)");
  }
  uVar1 = (p_Var2->container).table.pl_end;
  uVar5 = (uint)len;
  if (!CARRY4(uVar1,uVar5)) {
    (p_Var2->container).table.pl_end = uVar1 + uVar5;
    uVar1 = B->ds_offset;
    uVar5 = uVar1 + uVar5;
    B->ds_offset = uVar5;
    if ((B->ds_limit <= uVar5) && (iVar3 = reserve_ds(B,(ulong)(uVar5 + 1),0xfffffffc), iVar3 != 0))
    {
      return (char *)0x0;
    }
    if (B->ds == (uint8_t *)0x0) {
      return (char *)0x0;
    }
    pcVar4 = (char *)memcpy(B->ds + uVar1,s,len & 0xffffffff);
    return pcVar4;
  }
  __assert_fail("n <= n1 && n1 <= max_count",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x391,
                "int vector_count_add(flatcc_builder_t *, flatbuffers_uoffset_t, flatbuffers_uoffset_t)"
               );
}

Assistant:

char *flatcc_builder_append_string(flatcc_builder_t *B, const char *s, size_t len)
{
    check(frame(type) == flatcc_builder_string, "expected string frame");
    if (vector_count_add(B, (uoffset_t)len, max_string_len)) {
        return 0;
    }
    return push_ds_copy(B, s, (uoffset_t)len);
}